

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_timingsafe_bcmp(void *a,void *b,uint32_t len)

{
  byte local_31;
  byte *pbStack_30;
  uint8_t sum;
  uint8_t *pb;
  uint8_t *pa;
  uint32_t len_local;
  void *b_local;
  void *a_local;
  
  local_31 = 0;
  pbStack_30 = (byte *)b;
  pb = (uint8_t *)a;
  pa._4_4_ = len;
  while (pa._4_4_ != 0) {
    local_31 = local_31 | *pb ^ *pbStack_30;
    pbStack_30 = pbStack_30 + 1;
    pb = pb + 1;
    pa._4_4_ = pa._4_4_ - 1;
  }
  return (int)local_31;
}

Assistant:

int
lws_timingsafe_bcmp(const void *a, const void *b, uint32_t len)
{
	const uint8_t *pa = a, *pb = b;
	uint8_t sum = 0;

	while (len--)
		sum |= (uint8_t)(*pa++ ^ *pb++);

	return sum;
}